

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O2

UINT8 device_start_ymz280b(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  double dVar1;
  DEV_DATA info;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  UINT8 UVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  
  info.chipInf = calloc(1,0x2e8);
  if ((DEV_DATA *)info.chipInf == (DEV_DATA *)0x0) {
    UVar5 = 0xff;
  }
  else {
    if (lookup_init == '\0') {
      piVar2 = diff_lookup;
      uVar3 = 0;
      for (uVar4 = 0; uVar4 != 0x10; uVar4 = uVar4 + 1) {
        iVar6 = (uVar3 & 0xe) + 1;
        iVar7 = -iVar6;
        if (uVar4 < 8) {
          iVar7 = iVar6;
        }
        *piVar2 = iVar7;
        piVar2 = piVar2 + 1;
        uVar3 = uVar3 + 2;
      }
      lookup_init = '\x01';
    }
    pvVar8 = (void *)((double)cfg->clock / 384.0);
    ((DEV_DATA *)((long)info.chipInf + 0x2c0))->chipInf = pvVar8;
    ((DEV_DATA *)((long)info.chipInf + 0x2c8))->chipInf = (void *)((double)pvVar8 + (double)pvVar8);
    pvVar8 = calloc(10000,2);
    ((DEV_DATA *)((long)info.chipInf + 0x2e0))->chipInf = pvVar8;
    UVar5 = '\0';
    ymz280b_set_mute_mask(info.chipInf,0);
    *(void **)info.chipInf = info.chipInf;
    dVar1 = *(double *)((long)info.chipInf + 0x2c8);
    retDevInf->dataPtr = (DEV_DATA *)info.chipInf;
    retDevInf->sampleRate = (UINT32)(long)dVar1;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar5;
}

Assistant:

static UINT8 device_start_ymz280b(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	ymz280b_state *chip;

	chip = (ymz280b_state *)calloc(1, sizeof(ymz280b_state));
	if (chip == NULL)
		return 0xFF;

	/* compute ADPCM tables */
	compute_tables();

	/* initialize the rest of the structure */
	chip->master_clock = (double)cfg->clock / 384.0;
	chip->rate = chip->master_clock * 2.0;
	// disabled until the frequency calculation gets fixed
	//SRATE_CUSTOM_HIGHEST(cfg->srMode, chip->rate, cfg->smplRate);
	
	chip->mem_size = 0x00;
	chip->mem_base = NULL;
	chip->irq_handler = NULL;
	chip->irq_param = NULL;
	chip->ext_read_handler = NULL;
	chip->ext_write_handler = NULL;
	chip->ext_param = NULL;

	/* allocate memory */
	chip->scratch = (INT16*)calloc(MAX_SAMPLE_CHUNK, sizeof(INT16));

	ymz280b_set_mute_mask(chip, 0x00);

	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, (UINT32)INTERNAL_SAMPLE_RATE, &devDef);

	return 0x00;
}